

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.cpp
# Opt level: O2

void __thiscall Memory::RecyclerSweep::ShutdownCleanup(RecyclerSweep *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  long lVar4;
  undefined8 *in_FS_OFFSET;
  
  HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::DeleteHeapBlockList
            ((this->leafData).pendingMergeNewHeapBlockList,this->recycler);
  HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::DeleteHeapBlockList
            ((this->normalData).pendingMergeNewHeapBlockList,this->recycler);
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
  DeleteHeapBlockList((this->withBarrierData).pendingMergeNewHeapBlockList,this->recycler);
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
  DeleteHeapBlockList((this->finalizableWithBarrierData).pendingMergeNewHeapBlockList,this->recycler
                     );
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
  DeleteHeapBlockList((this->finalizableData).pendingMergeNewHeapBlockList,this->recycler);
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  for (lVar4 = -0x780; lVar4 != 0; lVar4 = lVar4 + 0x28) {
    if (*(long *)((long)(this->normalData).bucketData + lVar4 + -8) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.cpp"
                         ,0x71,"(this->leafData.bucketData[i].pendingSweepList == nullptr)",
                         "this->leafData.bucketData[i].pendingSweepList == nullptr");
      if (!bVar3) goto LAB_002a556c;
      *puVar1 = 0;
    }
    HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::DeleteHeapBlockList
              (*(SmallNormalHeapBlockT<SmallAllocationBlockAttributes> **)
                ((long)(this->finalizableData).bucketData + lVar4 + -8),this->recycler);
    HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
    DeleteHeapBlockList(*(SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> **)
                         ((long)(this->withBarrierData).bucketData + lVar4 + -8),this->recycler);
    HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
    DeleteHeapBlockList(*(SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> **)
                         ((long)(this->mediumLeafData).bucketData + lVar4 + -8),this->recycler);
    HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::
    DeleteEmptyHeapBlockList
              (*(SmallLeafHeapBlockT<SmallAllocationBlockAttributes> **)
                ((long)&(this->normalData).bucketData[0].pendingFinalizableSweptList + lVar4));
    HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
    DeleteEmptyHeapBlockList
              (*(SmallNormalHeapBlockT<SmallAllocationBlockAttributes> **)
                ((long)&(this->finalizableData).bucketData[0].pendingFinalizableSweptList + lVar4));
    HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
    DeleteEmptyHeapBlockList
              (*(SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> **)
                ((long)&(this->finalizableWithBarrierData).bucketData[0].pendingFinalizableSweptList
                + lVar4));
    if (*(long *)((long)&(this->mediumLeafData).bucketData[0].pendingFinalizableSweptList + lVar4)
        != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.cpp"
                         ,0x7c,
                         "(this->finalizableWithBarrierData.bucketData[i].pendingEmptyBlockList == nullptr)"
                         ,
                         "this->finalizableWithBarrierData.bucketData[i].pendingEmptyBlockList == nullptr"
                        );
      if (!bVar3) goto LAB_002a556c;
      *puVar1 = 0;
    }
    if (*(long *)((long)&(this->withBarrierData).bucketData[0].pendingFinalizableSweptList + lVar4)
        != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.cpp"
                         ,0x7e,
                         "(this->finalizableData.bucketData[i].pendingEmptyBlockList == nullptr)",
                         "this->finalizableData.bucketData[i].pendingEmptyBlockList == nullptr");
      if (!bVar3) goto LAB_002a556c;
      *puVar1 = 0;
    }
  }
  HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::DeleteHeapBlockList
            ((this->mediumLeafData).pendingMergeNewHeapBlockList,this->recycler);
  HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::DeleteHeapBlockList
            ((this->mediumNormalData).pendingMergeNewHeapBlockList,this->recycler);
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
  DeleteHeapBlockList((this->mediumWithBarrierData).pendingMergeNewHeapBlockList,this->recycler);
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
  DeleteHeapBlockList((this->mediumFinalizableWithBarrierData).pendingMergeNewHeapBlockList,
                      this->recycler);
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
  DeleteHeapBlockList((this->mediumFinalizableData).pendingMergeNewHeapBlockList,this->recycler);
  lVar4 = -0x488;
  do {
    if (lVar4 == 0) {
      return;
    }
    if (*(long *)((long)(this->mediumNormalData).bucketData + lVar4 + -8) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.cpp"
                         ,0x8c,"(this->mediumLeafData.bucketData[i].pendingSweepList == nullptr)",
                         "this->mediumLeafData.bucketData[i].pendingSweepList == nullptr");
      if (!bVar3) {
LAB_002a556c:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
    DeleteHeapBlockList(*(SmallNormalHeapBlockT<MediumAllocationBlockAttributes> **)
                         ((long)(this->mediumFinalizableData).bucketData + lVar4 + -8),
                        this->recycler);
    HeapBucketT<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
    DeleteHeapBlockList(*(SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> **)
                         ((long)(this->mediumWithBarrierData).bucketData + lVar4 + -8),
                        this->recycler);
    HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
    DeleteHeapBlockList(*(SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> **)
                         ((long)&(this->mediumFinalizableWithBarrierData).
                                 pendingMergeNewHeapBlockList + lVar4),this->recycler);
    HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_>::
    DeleteEmptyHeapBlockList
              (*(SmallLeafHeapBlockT<MediumAllocationBlockAttributes> **)
                ((long)&(this->mediumNormalData).bucketData[0].pendingFinalizableSweptList + lVar4))
    ;
    HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
    DeleteEmptyHeapBlockList
              (*(SmallNormalHeapBlockT<MediumAllocationBlockAttributes> **)
                ((long)&(this->mediumFinalizableData).bucketData[0].pendingFinalizableSweptList +
                lVar4));
    HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
    DeleteEmptyHeapBlockList
              (*(SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> **)
                ((long)&(this->mediumFinalizableWithBarrierData).bucketData[0].
                        pendingFinalizableSweptList + lVar4));
    if (*(long *)((long)this[1].leafData.bucketData + lVar4 + -0x38) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.cpp"
                         ,0x97,
                         "(this->mediumFinalizableWithBarrierData.bucketData[i].pendingEmptyBlockList == nullptr)"
                         ,
                         "this->mediumFinalizableWithBarrierData.bucketData[i].pendingEmptyBlockList == nullptr"
                        );
      if (!bVar3) goto LAB_002a556c;
      *puVar1 = 0;
    }
    if (*(long *)((long)&(this->mediumWithBarrierData).bucketData[0].pendingFinalizableSweptList +
                 lVar4) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.cpp"
                         ,0x99,
                         "(this->mediumFinalizableData.bucketData[i].pendingEmptyBlockList == nullptr)"
                         ,
                         "this->mediumFinalizableData.bucketData[i].pendingEmptyBlockList == nullptr"
                        );
      if (!bVar3) goto LAB_002a556c;
      *puVar1 = 0;
    }
    lVar4 = lVar4 + 0x28;
  } while( true );
}

Assistant:

void
RecyclerSweep::ShutdownCleanup()
{
    // REVIEW: Does this need to be controlled more granularly, say with ENABLE_PARTIAL_GC?
#if ENABLE_CONCURRENT_GC
    SmallLeafHeapBucketT<SmallAllocationBlockAttributes>::DeleteHeapBlockList(this->leafData.pendingMergeNewHeapBlockList, recycler);
    SmallNormalHeapBucket::DeleteHeapBlockList(this->normalData.pendingMergeNewHeapBlockList, recycler);
#ifdef RECYCLER_WRITE_BARRIER
    SmallNormalWithBarrierHeapBucket::DeleteHeapBlockList(this->withBarrierData.pendingMergeNewHeapBlockList, recycler);
    SmallFinalizableWithBarrierHeapBucket::DeleteHeapBlockList(this->finalizableWithBarrierData.pendingMergeNewHeapBlockList, recycler);
#endif
    SmallFinalizableHeapBucket::DeleteHeapBlockList(this->finalizableData.pendingMergeNewHeapBlockList, recycler);
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        // For leaf, we can always reuse the page as we don't need to rescan them for partial GC
        // It should have been swept immediately during Sweep
        Assert(this->leafData.bucketData[i].pendingSweepList == nullptr);
        SmallNormalHeapBucket::DeleteHeapBlockList(this->normalData.bucketData[i].pendingSweepList, recycler);
        SmallFinalizableHeapBucket::DeleteHeapBlockList(this->finalizableData.bucketData[i].pendingSweepList, recycler);
#ifdef RECYCLER_WRITE_BARRIER
        SmallFinalizableWithBarrierHeapBucket::DeleteHeapBlockList(this->finalizableWithBarrierData.bucketData[i].pendingSweepList, recycler);
#endif

        SmallLeafHeapBucket::DeleteEmptyHeapBlockList(this->leafData.bucketData[i].pendingEmptyBlockList);
        SmallNormalHeapBucket::DeleteEmptyHeapBlockList(this->normalData.bucketData[i].pendingEmptyBlockList);
#ifdef RECYCLER_WRITE_BARRIER
        SmallNormalWithBarrierHeapBucket::DeleteEmptyHeapBlockList(this->withBarrierData.bucketData[i].pendingEmptyBlockList);
        Assert(this->finalizableWithBarrierData.bucketData[i].pendingEmptyBlockList == nullptr);
#endif
        Assert(this->finalizableData.bucketData[i].pendingEmptyBlockList == nullptr);
    }

    MediumLeafHeapBucket::DeleteHeapBlockList(this->mediumLeafData.pendingMergeNewHeapBlockList, recycler);
    MediumNormalHeapBucket::DeleteHeapBlockList(this->mediumNormalData.pendingMergeNewHeapBlockList, recycler);
#ifdef RECYCLER_WRITE_BARRIER
    MediumNormalWithBarrierHeapBucket::DeleteHeapBlockList(this->mediumWithBarrierData.pendingMergeNewHeapBlockList, recycler);
    MediumFinalizableWithBarrierHeapBucket::DeleteHeapBlockList(this->mediumFinalizableWithBarrierData.pendingMergeNewHeapBlockList, recycler);
#endif
    MediumFinalizableHeapBucket::DeleteHeapBlockList(this->mediumFinalizableData.pendingMergeNewHeapBlockList, recycler);
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        // For leaf, we can always reuse the page as we don't need to rescan them for partial GC
        // It should have been swept immediately during Sweep
        Assert(this->mediumLeafData.bucketData[i].pendingSweepList == nullptr);
        MediumNormalHeapBucket::DeleteHeapBlockList(this->mediumNormalData.bucketData[i].pendingSweepList, recycler);
        MediumFinalizableHeapBucket::DeleteHeapBlockList(this->mediumFinalizableData.bucketData[i].pendingSweepList, recycler);
#ifdef RECYCLER_WRITE_BARRIER
        MediumFinalizableWithBarrierHeapBucket::DeleteHeapBlockList(this->mediumFinalizableWithBarrierData.bucketData[i].pendingSweepList, recycler);
#endif

        MediumLeafHeapBucket::DeleteEmptyHeapBlockList(this->mediumLeafData.bucketData[i].pendingEmptyBlockList);
        MediumNormalHeapBucket::DeleteEmptyHeapBlockList(this->mediumNormalData.bucketData[i].pendingEmptyBlockList);
#ifdef RECYCLER_WRITE_BARRIER
        MediumNormalWithBarrierHeapBucket::DeleteEmptyHeapBlockList(this->mediumWithBarrierData.bucketData[i].pendingEmptyBlockList);
        Assert(this->mediumFinalizableWithBarrierData.bucketData[i].pendingEmptyBlockList == nullptr);
#endif
        Assert(this->mediumFinalizableData.bucketData[i].pendingEmptyBlockList == nullptr);
    }
#endif
}